

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O2

void __thiscall myutils::IpcConnection::IpcConnection(IpcConnection *this)

{
  MessageLoop *this_00;
  Closure local_50;
  _Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()> local_30;
  
  (this->super_Connection)._vptr_Connection = (_func_int **)&PTR__Connection_0016d9b0;
  loop::MsgLoopRun::MsgLoopRun(&this->super_MsgLoopRun);
  (this->super_Connection)._vptr_Connection = (_func_int **)&PTR__IpcConnection_0016d8c8;
  (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)&PTR__IpcConnection_0016d918;
  (this->m_addr)._M_dataplus._M_p = (pointer)&(this->m_addr).field_2;
  (this->m_addr)._M_string_length = 0;
  (this->m_addr).field_2._M_local_buf[0] = '\0';
  (this->m_send_mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_send_mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_send_mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_send_mtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_send_mtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_callback = (Connection_Callback *)0x0;
  this->m_should_exit = false;
  this->m_connected = false;
  this->m_my_id = 0;
  this->m_my_shmem = (FileMapping *)0x0;
  this->m_svr_shmem = (FileMapping *)0x0;
  this->m_recv_queue = (ShmemQueue *)0x0;
  this->m_send_queue = (ShmemQueue *)0x0;
  this->m_recv_thread = (thread *)0x0;
  this->m_slot_info = (ConnectionSlotInfo *)0x0;
  this->m_slot = (ConnectionSlot *)0x0;
  (this->m_last_connect_time).__d.__r = 0;
  this->m_sem_send = (SharedSemaphore *)0x0;
  this->m_sem_recv = (SharedSemaphore *)0x0;
  this->m_socket = -1;
  local_30._M_f = (offset_in_IpcConnection_to_subr)check_connection;
  local_30._8_8_ = 0;
  local_30._M_bound_args.super__Tuple_impl<0UL,_myutils::IpcConnection_*>.
  super__Head_base<0UL,_myutils::IpcConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_myutils::IpcConnection_*>)(_Tuple_impl<0UL,_myutils::IpcConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,void>
            ((function<void()> *)&local_50,&local_30);
  this_00 = &(this->super_MsgLoopRun).m_msg_loop;
  loop::MessageLoop::post_delayed_task(this_00,&local_50,500);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  local_30._M_f = (offset_in_IpcConnection_to_subr)on_idle_timer;
  local_30._8_8_ = 0;
  local_30._M_bound_args.super__Tuple_impl<0UL,_myutils::IpcConnection_*>.
  super__Head_base<0UL,_myutils::IpcConnection_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_myutils::IpcConnection_*>)(_Tuple_impl<0UL,_myutils::IpcConnection_*>)this;
  std::function<void()>::
  function<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,void>
            ((function<void()> *)&local_50,&local_30);
  loop::MessageLoop::post_delayed_task(this_00,&local_50,1000);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return;
}

Assistant:

IpcConnection::IpcConnection()
    : m_callback(nullptr)
    , m_should_exit(false)
    , m_connected(false)
    , m_my_id(0)
    , m_my_shmem(nullptr)
    , m_svr_shmem(nullptr)
    , m_recv_queue(nullptr)
    , m_send_queue(nullptr)
    , m_recv_thread(nullptr)
    , m_slot_info(nullptr)
    , m_slot(nullptr)
    , m_sem_send(nullptr)
    , m_sem_recv(nullptr)
    , m_socket(INVALID_SOCKET)
{
    m_msg_loop.post_delayed_task(bind(&IpcConnection::check_connection, this),  500);
    m_msg_loop.post_delayed_task(bind(&IpcConnection::on_idle_timer,    this), 1000);
}